

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::commandsAfterCompute
          (BinaryAtomicIntermValuesInstance *this,VkCommandBuffer cmdBuffer)

{
  UVec3 *imageSize;
  VkImageSubresourceRange subresourceRange;
  deUint32 dVar1;
  DeviceInterface *pDVar2;
  deUint32 arraySize;
  VkExtent3D extent;
  UVec3 layerSize;
  VkBufferImageCopy bufferImageCopyParams;
  VkImageMemoryBarrier imagePostDispatchBarrier;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  imageSize = &(this->super_BinaryAtomicInstanceBase).m_imageSize;
  dVar1 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar1;
  makeImageMemoryBarrier
            (&imagePostDispatchBarrier,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)(((this->m_intermResultsImage).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                        m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange);
  arraySize = 0;
  (*pDVar2->_vptr_DeviceInterface[0x6d])
            (pDVar2,cmdBuffer,0x800,0x1000,0,0,0,0,0,1,(int)&imagePostDispatchBarrier);
  getLayerSize((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  dVar1 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  extent.height = 0;
  extent.width = layerSize.m_data[2];
  extent.depth = dVar1;
  makeBufferImageCopy(&bufferImageCopyParams,
                      (image *)CONCAT44(layerSize.m_data[1],layerSize.m_data[0] * 5),extent,
                      arraySize);
  (*pDVar2->_vptr_DeviceInterface[99])
            (pDVar2,cmdBuffer,
             (((this->m_intermResultsImage).
               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
              ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             6,(((this->super_BinaryAtomicInstanceBase).m_outputBuffer.
                 super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                 m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,1,(int)&bufferImageCopyParams);
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::commandsAfterCompute (const VkCommandBuffer cmdBuffer) const
{
	const DeviceInterface&			deviceInterface		= m_context.getDeviceInterface();
	const VkImageSubresourceRange	subresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	const VkImageMemoryBarrier	imagePostDispatchBarrier =
		makeImageMemoryBarrier(	VK_ACCESS_SHADER_WRITE_BIT,
								VK_ACCESS_TRANSFER_READ_BIT,
								VK_IMAGE_LAYOUT_GENERAL,
								VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
								m_intermResultsImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &imagePostDispatchBarrier);

	const UVec3					layerSize				= getLayerSize(m_imageType, m_imageSize);
	const UVec3					extendedLayerSize		= UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), layerSize.y(), layerSize.z());
	const VkBufferImageCopy		bufferImageCopyParams	= makeBufferImageCopy(makeExtent3D(extendedLayerSize), getNumLayers(m_imageType, m_imageSize));

	deviceInterface.cmdCopyImageToBuffer(cmdBuffer, m_intermResultsImage->get(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, m_outputBuffer->get(), 1u, &bufferImageCopyParams);
}